

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeVarArray<Js::AuxArray<void*>>
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  code *pcVar2;
  double value_00;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  byte *pbVar8;
  uint64 uVar9;
  uint64 uVar10;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  undefined8 local_40;
  int8 value;
  byte local_31 [8];
  byte code;
  
  uVar6 = *(uint *)buffer;
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 <= (ulong)uVar6 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1261,
                                "(serialized->offset + sizeof(T) < deserializeInto->GetLength())",
                                "serialized->offset + sizeof(T) < deserializeInto->GetLength()");
    if (!bVar4) goto LAB_00887ff9;
    *puVar7 = 0;
  }
  pbVar8 = ByteBlock::GetBuffer(deserializeInto);
  uVar6 = *(uint *)buffer;
  uVar11 = (ulong)*(uint *)(buffer + 5);
  *(uint *)(pbVar8 + uVar6) = *(uint *)(buffer + 5);
  uVar1 = *(uint *)buffer;
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 < (ulong)uVar1 + uVar11 * 8 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1265,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar4) {
LAB_00887ff9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  pbVar13 = buffer + 9;
  if (uVar11 != 0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lVar3 = (ulong)uVar6 + 8;
    uVar12 = 0;
    do {
      pbVar13 = ReadByte(pbVar13,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar13)),
                         local_31);
      switch(local_31[0]) {
      case 1:
        pbVar13 = ReadByte(pbVar13,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar13)),
                           (byte *)&local_40);
        uVar6 = (uint)(char)(byte)local_40;
        break;
      case 2:
        pbVar13 = ReadConstantSizedInt16
                            (pbVar13,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar13)),
                             (int16 *)&local_40);
        uVar6 = (uint)CONCAT11(local_40._1_1_,(byte)local_40);
        break;
      case 3:
        pbVar13 = ReadConstantSizedInt32
                            (pbVar13,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar13)),
                             (int *)&local_40);
        uVar6 = CONCAT22(local_40._2_2_,CONCAT11(local_40._1_1_,(byte)local_40));
        break;
      case 4:
        pbVar13 = ReadDouble(pbVar13,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar13)),
                             (double *)&local_40);
        value_00 = (double)CONCAT44(local_40._4_4_,
                                    CONCAT22(local_40._2_2_,CONCAT11(local_40._1_1_,(byte)local_40))
                                   );
        uVar9 = NumberUtilities::ToSpecial(value_00);
        bVar4 = NumberUtilities::IsNan(value_00);
        if (((bVar4) &&
            (uVar10 = NumberUtilities::ToSpecial(value_00), uVar10 != 0xfff8000000000000)) &&
           (uVar10 = NumberUtilities::ToSpecial(value_00), uVar10 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar4) goto LAB_00887ff9;
          *puVar7 = 0;
        }
        *(uint64 *)(pbVar8 + uVar12 * 8 + lVar3) = uVar9 ^ 0xfffc000000000000;
        goto LAB_00887f8c;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x1291,"((0))","Unexpected object type in VarArray");
        if (bVar4) {
          *puVar7 = 0;
          Throw::FatalInternalError(-0x7fffbffb);
        }
        goto LAB_00887ff9;
      }
      *(ulong *)(pbVar8 + uVar12 * 8 + lVar3) = (ulong)uVar6 | 0x1000000000000;
LAB_00887f8c:
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  return pbVar13;
}

Assistant:

const byte * DeserializeVarArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const Js::SerializedVarArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxVarArray);
#endif
        Assert(serialized->offset + sizeof(T) < deserializeInto->GetLength());
        auto result = (T *)(deserializeInto->GetBuffer() + serialized->offset);
        uint count = serialized->varCount;
        result->SetCount(count);
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto content = (const byte*)(serialized + 1);
        auto current = content;
        for (uint index = 0; index < count; index++)
        {
            byte code;
            current = ReadByte(current, &code);
            switch(code)
            {
                case ctInt32:
                    {
                        int value;
                        current = ReadConstantSizedInt32(current, &value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctInt16:
                    {
                        int16 value;
                        current = ReadConstantSizedInt16(current, &value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctInt8:
                    {
                        int8 value;
                        current = ReadByte(current, (byte *)&value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctNumber:
                    {
                        double value;
                        current = ReadDouble(current, &value);
                        const auto number = Js::JavascriptNumber::New(value, scriptContext);
#if !FLOATVAR
                        scriptContext->BindReference(number);
#endif
                        result->elements[index] = number;
                        break;
                    }

                default:
                    AssertMsg(UNREACHED, "Unexpected object type in VarArray");
                    Throw::FatalInternalError();
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxVarArray);
#endif
        return current;
    }